

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastVerify.cpp
# Opt level: O0

void cast_verify::TestFloat(void)

{
  ostream *poVar1;
  bool fSuccess;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  test;
  uint i;
  CastTest<float> tests [5];
  float *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_38;
  uint local_2c;
  byte abStack_24 [36];
  
  InitializeCastArray<float>
            ((CastTest<float> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             (size_t)in_stack_ffffffffffffffb8);
  for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_38);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc7 = 1;
    if ((abStack_24[(ulong)local_2c * 8] & 1) != 1) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Error in cast float to std::uint64_t case ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void TestFloat()
	{
		CastTest<float> tests[5];

		InitializeCastArray(tests, _countof(tests));

		for (unsigned i = 0; i < _countof(tests); ++i)
		{
			SafeInt<std::uint64_t> test;
			bool fSuccess;

			try
			{
				test = tests[i].x;
				fSuccess = true;
			}
			catch (...)
			{
				fSuccess = false;
			}

			if (fSuccess != tests[i].fExpected)
				std::cerr << "Error in cast float to std::uint64_t case " << i << std::endl;
		}
	}